

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void decompile(Decompiler *decompiler,Image *image,uint64_t time_offset,bool ignore_named_objects)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  ostringstream decompiled_code;
  DebugStream local_221;
  char *local_220;
  long local_218;
  char local_210 [16];
  undefined1 *local_200;
  long local_1f8;
  undefined1 local_1f0 [16];
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  char *local_1c0;
  long local_1b8;
  char local_1b0 [16];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  r_comp::Decompiler::decompile
            ((Image *)decompiler,(ostringstream *)image,(ulong)local_1a0,SUB81(time_offset,0));
  puVar3 = local_1d0;
  local_1e0 = puVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"main","");
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char*>((string *)&local_220,local_1e0,local_1e0 + local_1d8);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_220,local_218);
    if (local_220 != local_210) {
      operator_delete(local_220);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"decompilation:\n",0xf)
    ;
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1c0,local_1b8);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0);
    }
    DebugStream::~DebugStream(&local_221);
    if (local_1e0 != puVar3) {
      operator_delete(local_1e0);
    }
    puVar3 = local_1f0;
    local_200 = puVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"main","");
    local_220 = local_210;
    std::__cxx11::string::_M_construct<char*>((string *)&local_220,local_200,local_200 + local_1f8);
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
    if (iVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_220,local_218);
      if (local_220 != local_210) {
        operator_delete(local_220);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"objects",7);
      DebugStream::~DebugStream(&local_221);
      if (local_200 != puVar3) {
        operator_delete(local_200);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
      std::ios_base::~ios_base(local_130);
      return;
    }
  }
  else {
    iVar1 = std::__throw_system_error(iVar1);
  }
  uVar2 = std::__throw_system_error(iVar1);
  if (local_200 != puVar3) {
    operator_delete(local_200);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  _Unwind_Resume(uVar2);
}

Assistant:

void decompile(Decompiler &decompiler, r_comp::Image *image, uint64_t time_offset, bool ignore_named_objects)
{
#ifdef DECOMPILE_ONE_BY_ONE
    uint64_t object_count = decompiler.decompile_references(image);
    std::cout << object_count << " objects in the image\n";

    while (1) {
        std::cout << "> which object (-1 to exit)?\n";
        int64_t index;
        std::cin >> index;

        if (index == -1) {
            break;
        }

        if (index >= object_count) {
            std::cout << "> there is only " << object_count << " objects\n";
            continue;
        }

        std::ostringstream decompiled_code;
        decompiler.decompile_object(index, &decompiled_code, time_offset);
        std::cout << "\n\n> DECOMPILATION\n\n" << decompiled_code.str() << std::endl;
    }

#else
    std::ostringstream decompiled_code;
    uint64_t object_count = decompiler.decompile(image, &decompiled_code, time_offset, ignore_named_objects);
    //uint64_t object_count=image->code_segment.objects.size();
    debug("main") << "decompilation:\n" << decompiled_code.str();
    //debug("main") << "image taken at:" << Time::ToString_year(image->timestamp);
    debug("main") << object_count << "objects";
#endif
}